

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cc
# Opt level: O2

size_t xemmai::t_type_of<xemmai::t_object>::f_do_call(t_object *a_this,t_pvalue *a_stack,size_t a_n)

{
  t_object *local_10;
  
  local_10 = a_this;
  f_bind_class<xemmai::t_object*&>
            (a_this->v_type,&local_10,a_this->v_type->v_instance_fields + 1,a_stack);
  return a_n;
}

Assistant:

size_t t_type::f_do_call(t_object* a_this, t_pvalue* a_stack, size_t a_n)
{
	auto type = a_this->f_type();
	type->f_bind_class(a_this, type->v_instance_fields + 1, a_stack);
	return a_n;
}